

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O2

void Omega_h::vtk::describe_array<int>(ostream *stream,string *name,Int ncomps)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,"type=\"");
  poVar1 = std::operator<<(poVar1,"Int32");
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(stream," Name=\"");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(stream," NumberOfComponents=\"");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,ncomps);
  std::operator<<(poVar1,"\"");
  std::operator<<(stream," format=\"binary\"");
  return;
}

Assistant:

void describe_array(std::ostream& stream, std::string const& name, Int ncomps) {
  stream << "type=\"" << Traits<T>::name() << "\"";
  stream << " Name=\"" << name << "\"";
  stream << " NumberOfComponents=\"" << ncomps << "\"";
  stream << " format=\"binary\"";
}